

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O0

void __thiscall tensor_t<float>::tensor_t(tensor_t<float> *this,tensor_t<float> *other)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  tensor_t<float> *other_local;
  tensor_t<float> *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((other->size).x * (other->size).y * (other->size).z);
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pfVar4 = (float *)operator_new__(uVar3);
  this->data = pfVar4;
  memcpy(this->data,other->data,(long)((other->size).x * (other->size).y * (other->size).z) << 2);
  iVar2 = (other->size).y;
  (this->size).x = (other->size).x;
  (this->size).y = iVar2;
  (this->size).z = (other->size).z;
  return;
}

Assistant:

tensor_t( const tensor_t& other )
	{
		data = new T[other.size.x *other.size.y *other.size.z];
		memcpy(
			this->data,
			other.data,
			other.size.x *other.size.y *other.size.z * sizeof( T )
		);
		this->size = other.size;
	}